

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlipTiles.cpp
# Opt level: O3

void __thiscall commands::FlipTiles::execute(FlipTiles *this)

{
  pointer pVVar1;
  ulong uVar2;
  long lVar3;
  Tile tile;
  Tile TStack_38;
  
  Command::execute(&this->super_Command);
  pVVar1 = (this->tilePositions_).
           super__Vector_base<sf::Vector2<int>,_std::allocator<sf::Vector2<int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->tilePositions_).
      super__Vector_base<sf::Vector2<int>,_std::allocator<sf::Vector2<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      Board::accessTile(&TStack_38,this->board_,(Vector2i *)((long)&pVVar1->x + lVar3));
      Tile::flip(&TStack_38,this->acrossVertical_);
      if (this->highlightTiles_ == true) {
        Tile::setHighlight(&TStack_38,true);
      }
      uVar2 = uVar2 + 1;
      pVVar1 = (this->tilePositions_).
               super__Vector_base<sf::Vector2<int>,_std::allocator<sf::Vector2<int>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 8;
    } while (uVar2 < (ulong)((long)(this->tilePositions_).
                                   super__Vector_base<sf::Vector2<int>,_std::allocator<sf::Vector2<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 3));
  }
  return;
}

Assistant:

void FlipTiles::execute() {
    Command::execute();
    for (size_t i = 0; i < tilePositions_.size(); ++i) {
        auto tile = board_.accessTile(tilePositions_[i]);
        tile.flip(acrossVertical_);
        if (highlightTiles_) {
            tile.setHighlight(true);
        }
    }
}